

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O3

void DebugDer(ostream *outFile,uchar *pIn,size_t cbIn,unsigned_long level)

{
  byte bVar1;
  undefined1 uVar2;
  bool bVar3;
  ostream *poVar4;
  ostream *poVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong uVar9;
  BasicDerType local_90;
  long local_80;
  uchar *local_78;
  unsigned_long local_70;
  size_t local_68;
  size_t cbRead;
  undefined1 local_54 [8];
  DerTypeContainer type;
  size_t size;
  long cbIn_00;
  
  if (1 < cbIn) {
    uVar9 = 0;
    type._class = Universal;
    type.constructed = false;
    type._9_3_ = 0;
    local_68 = 0;
    local_70 = level + 1;
    local_80 = (long)(int)local_70;
    cbRead = (size_t)outFile;
    while( true ) {
      bVar1 = pIn[uVar9];
      local_54._0_4_ = bVar1 & (BMPString|Boolean);
      local_54._4_4_ = ZEXT14(bVar1 >> 6);
      type.type._0_1_ = bVar1 >> 5 & Boolean;
      bVar3 = DecodeSize(pIn + uVar9 + 1,cbIn - (uVar9 + 1),(size_t *)&type._class,&local_68);
      if (!bVar3) break;
      lVar6 = *(long *)outFile;
      poVar5 = outFile + *(long *)(lVar6 + -0x18);
      lVar8 = uVar9 + 1 + local_68;
      if (outFile[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar5);
        poVar5[0xe1] = (ostream)0x1;
        lVar6 = *(long *)outFile;
      }
      poVar5[0xe0] = (ostream)0x20;
      *(long *)(outFile + *(long *)(lVar6 + -0x18) + 0x10) = local_80;
      std::__ostream_insert<char,std::char_traits<char>>(outFile,"  ",2);
      uVar2 = (undefined1)type.type;
      poVar4 = operator<<(outFile,(DerTypeContainer *)local_54);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," 0x",3);
      lVar6 = *(long *)poVar4;
      poVar5 = poVar4 + *(long *)(lVar6 + -0x18);
      if (uVar2 == Boolean) {
        if (poVar4[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar5);
          poVar5[0xe1] = (ostream)0x1;
          lVar6 = *(long *)poVar4;
        }
        cbIn_00 = type._4_8_;
        poVar5[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x10) = 2;
        *(uint *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        outFile = (ostream *)cbRead;
        DebugDer((ostream *)cbRead,pIn + lVar8,cbIn_00,local_70);
      }
      else {
        if (poVar4[*(long *)(lVar6 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar5);
          poVar5[0xe1] = (ostream)0x1;
          lVar6 = *(long *)poVar4;
        }
        cbIn_00 = type._4_8_;
        local_78 = pIn + uVar9;
        poVar5[0xe0] = (ostream)0x30;
        *(undefined8 *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x10) = 2;
        *(uint *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(lVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        BasicDerType::BasicDerType(&local_90,local_78,cbIn - uVar9);
        poVar5 = operator<<(poVar5,&local_90);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        outFile = (ostream *)cbRead;
      }
      uVar9 = cbIn_00 + lVar8;
      if (cbIn <= uVar9) {
        return;
      }
    }
  }
  puVar7 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar7 = std::__throw_bad_cast;
  __cxa_throw(puVar7,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

void DebugDer(std::ostream& outFile, const unsigned char * pIn, size_t cbIn, unsigned long level)
{
	if (cbIn < 2)
		throw std::exception(); // Corrupt input

	size_t size = 0;
	size_t cbRead = 0;
	size_t offset = 0;

	while (offset < cbIn)
	{
		DerTypeContainer type(*(pIn + offset));
		const unsigned char* pType = pIn + offset;
		size_t cbType = cbIn - offset;

		offset += 1;
		if (!DecodeSize(pIn + offset, cbIn - offset, size, cbRead))
			throw std::exception(); // Corrupt input

		offset += cbRead;

        outFile << std::setfill(' ') << std::setw(level + 1) << "  ";

		if (type.constructed)
		{
			// It is a set, or sequence, possibly app-specific
			// Print just the type, and the size, then recurse
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << std::endl;
			DebugDer(outFile, pIn + offset, size, level + 1);
		}
		else
		{
			// It is a primitive type
            outFile << type << " 0x" << std::setfill('0') << std::setw(2) << std::hex << size << " " << BasicDerType(pType, cbType) << std::endl;
		}

		// And increment to the next item
		offset += static_cast<size_t>(size);

	}

}